

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::state::encode_eob(state *this,symbol_codec *codec,search_accelerator *dict)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  search_accelerator *in_RDX;
  symbol_codec *in_RSI;
  search_accelerator *in_RDI;
  uint is_match_model_index;
  uint match_pred;
  int in_stack_ffffffffffffffcc;
  uint sym;
  search_accelerator *psVar4;
  uint bit;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  psVar4 = in_RDI;
  uVar2 = search_accelerator::get_cur_dict_size(in_RDX);
  sym = (uint)((ulong)in_RDX >> 0x20);
  bit = (uint)((ulong)psVar4 >> 0x20);
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = search_accelerator::get_char(in_RDI,in_stack_ffffffffffffffcc);
  }
  iVar3 = (uVar2 >> 2) + *(int *)((long)&in_RDI->m_pLZBase + 4) * 0x40;
  bVar1 = symbol_codec::encode
                    ((symbol_codec *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     bit,(adaptive_bit_model *)in_RSI,SUB41(sym >> 0x18,0));
  if (bVar1) {
    bVar1 = symbol_codec::encode
                      ((symbol_codec *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                       ,bit,(adaptive_bit_model *)in_RSI,SUB41(sym >> 0x18,0));
    if (bVar1) {
      bVar1 = symbol_codec::encode
                        (in_RSI,sym,(quasi_adaptive_huffman_data_model *)CONCAT44(uVar2,iVar3));
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lzcompressor::state::encode_eob(symbol_codec& codec, const search_accelerator& dict)
   {
#ifdef LZHAM_LZDEBUG
      if (!codec.encode_bits(CLZBase::cLZHAMDebugSyncMarkerValue, CLZBase::cLZHAMDebugSyncMarkerBits)) return false;
      if (!codec.encode_bits(1, 1)) return false;
      if (!codec.encode_bits(0, 9)) return false;
      if (!codec.encode_bits(m_cur_state, 4)) return false;
#endif

      uint match_pred = dict.get_cur_dict_size() ? dict.get_char(-1) : 0;
      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(match_pred, m_cur_state);
      if (!codec.encode(1, m_is_match_model[is_match_model_index])) return false;

      // full match
      if (!codec.encode(0, m_is_rep_model[m_cur_state])) return false;

      return codec.encode(CLZBase::cLZXSpecialCodeEndOfBlockCode, m_main_table);
   }